

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O0

string * __thiscall
helics::BrokerApp::query_abi_cxx11_
          (BrokerApp *this,string_view target,string_view queryStr,HelicsSequencingModes mode)

{
  bool bVar1;
  element_type *peVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  __shared_ptr *in_RSI;
  string *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_stack_00000008;
  allocator<char> *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  byte bVar3;
  allocator<char> in_stack_ffffffffffffffaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  bVar3 = 0;
  if (bVar1) {
    peVar2 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4210d6);
    (*peVar2->_vptr_Broker[0x11])(in_RDI,peVar2,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008);
  }
  else {
    std::allocator<char>::allocator();
    bVar3 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,
               (char *)CONCAT17(in_stack_ffffffffffffffaf,CONCAT16(1,in_stack_ffffffffffffffa8)),
               in_stack_ffffffffffffffa0);
  }
  if ((bVar3 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  }
  return in_RDI;
}

Assistant:

std::string
    BrokerApp::query(std::string_view target, std::string_view queryStr, HelicsSequencingModes mode)
{
    return (broker) ? broker->query(target, queryStr, mode) : std::string("#error");
}